

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O3

int lj_ffh_bit_bswap(lua_State *L)

{
  ulong uVar1;
  uint in_EAX;
  int iVar2;
  uint64_t uVar3;
  void *pvVar4;
  CTypeID id;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  uVar3 = lj_carith_check64(L,1,(CTypeID *)((long)&uStack_28 + 4));
  uVar1 = uStack_28;
  if (uStack_28._4_4_ == 0) {
    iVar2 = 0;
  }
  else {
    pvVar4 = lj_mem_newgco(L,0x18);
    *(undefined1 *)((long)pvVar4 + 9) = 10;
    *(short *)((long)pvVar4 + 10) = (short)(uVar1 >> 0x20);
    *(uint64_t *)((long)pvVar4 + 0x10) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    L->base[-2].u64 = (ulong)pvVar4 | 0xfffa800000000000;
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

LJLIB_ASM(bit_bswap)		LJLIB_REC(bit_unary IR_BSWAP)
{
#if LJ_HASFFI
  CTypeID id = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  return id ? bit_result64(L, id, lj_bswap64(x)) : FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}